

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void basic_test(void)

{
  void *pvVar1;
  void *pvVar2;
  fdb_doc *pfVar3;
  fdb_status fVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  size_t bodylen;
  ulong uVar9;
  fdb_doc *pfVar10;
  uint uVar11;
  long lVar12;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_rdonly;
  fdb_file_handle *dbfile_rdonly;
  fdb_doc *local_4f8 [5];
  size_t *local_4d0;
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  timeval __test_begin;
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  pcVar6 = fdb_get_lib_version();
  if (pcVar6 == (char *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x37);
LAB_00103c96:
    basic_test()::__test_pass = '\x01';
    pcVar6 = "version != __null && strlen(version) > 0";
    uVar11 = 0x37;
    goto LAB_00103f2d;
  }
  if (*pcVar6 == '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x37);
    basic_test()::__test_pass = '\x01';
    if (*pcVar6 == '\0') goto LAB_00103c96;
  }
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.seqtree_opt = '\x01';
  fconfig.compaction_threshold = '\0';
  fconfig.purging_interval = 1;
  fconfig.flags = 0;
  fVar4 = fdb_open(&dbfile,"./dummy1",&fconfig);
  if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
    pcVar6 = fdb_error_msg(FDB_RESULT_NO_SUCH_FILE);
    iVar5 = strcmp(pcVar6,"no such file");
    if (iVar5 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x44);
      basic_test()::__test_pass = '\x01';
      pcVar6 = fdb_error_msg(FDB_RESULT_NO_SUCH_FILE);
      iVar5 = strcmp(pcVar6,"no such file");
      if (iVar5 != 0) {
        pcVar6 = "!strcmp(fdb_error_msg(status), \"no such file\")";
        uVar11 = 0x44;
        goto LAB_00103f2d;
      }
    }
    fconfig.flags = 2;
    fVar4 = fdb_open(&dbfile,"./dummy1",&fconfig);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      fconfig.flags = 3;
      fVar4 = fdb_open(&dbfile,"./dummy1",&fconfig);
      if (fVar4 != FDB_RESULT_INVALID_CONFIG) {
        uVar11 = 0x4e;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x4e);
        pcVar6 = "status == FDB_RESULT_INVALID_CONFIG";
        goto LAB_00104de3;
      }
      pcVar6 = fdb_error_msg(FDB_RESULT_INVALID_CONFIG);
      iVar5 = strcmp(pcVar6,"invalid configuration");
      if (iVar5 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x4f);
        basic_test()::__test_pass = '\x01';
        pcVar6 = fdb_error_msg(FDB_RESULT_INVALID_CONFIG);
        iVar5 = strcmp(pcVar6,"invalid configuration");
        if (iVar5 != 0) {
          pcVar6 = "!strcmp(fdb_error_msg(status), \"invalid configuration\")";
          uVar11 = 0x4f;
          goto LAB_00103f2d;
        }
      }
      fconfig.flags = 1;
      fVar4 = fdb_open(&dbfile,"./dummy1",&fconfig);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcVar6 = fdb_error_msg(FDB_RESULT_SUCCESS);
        iVar5 = strcmp(pcVar6,"success");
        if (iVar5 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x55);
          basic_test()::__test_pass = '\x01';
          pcVar6 = fdb_error_msg(FDB_RESULT_SUCCESS);
          iVar5 = strcmp(pcVar6,"success");
          if (iVar5 != 0) {
            pcVar6 = "!strcmp(fdb_error_msg(status), \"success\")";
            uVar11 = 0x55;
            goto LAB_00103f2d;
          }
        }
        pcVar6 = fdb_get_file_version(dbfile);
        if (pcVar6 == (char *)0x0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x57);
LAB_00103f16:
          basic_test()::__test_pass = '\x01';
          pcVar6 = "file_version != __null && strlen(file_version) > 0";
          uVar11 = 0x57;
LAB_00103f2d:
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,uVar11,"void basic_test()");
        }
        if (*pcVar6 == '\0') {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x57);
          basic_test()::__test_pass = '\x01';
          if (*pcVar6 == '\0') goto LAB_00103f16;
        }
        fdb_close(dbfile);
        system("rm -rf  dummy* > errorlog.txt");
        fdb_open(&dbfile,"./dummy1",&fconfig);
        fdb_kvs_open_default(dbfile,&db,&kvs_config);
        fVar4 = fdb_set_log_callback(db,logCallbackFunc,"basic_test");
        if (fVar4 == FDB_RESULT_SUCCESS) {
          lVar12 = 0;
          for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
            sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
            sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
            sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
            sVar7 = strlen(keybuf);
            sVar8 = strlen(metabuf);
            bodylen = strlen(bodybuf);
            fdb_doc_create((fdb_doc **)((long)local_4f8 + lVar12),keybuf,sVar7,metabuf,sVar8,bodybuf
                           ,bodylen);
            fdb_set(db,local_4f8[uVar9]);
            lVar12 = lVar12 + 8;
          }
          fdb_doc_create(&rdoc,(void *)local_4d0[4],*local_4d0,(void *)local_4d0[7],local_4d0[1],
                         (void *)0x0,0);
          fVar4 = fdb_del(db,rdoc);
          if (fVar4 == FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            rdoc = (fdb_doc *)0x0;
            fdb_commit(dbfile,'\0');
            fdb_get_file_info(dbfile,&info);
            if (info.doc_count != 9) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              if (info.doc_count != 9) {
                pcVar6 = "info.doc_count == 9";
                uVar11 = 0x7a;
                goto LAB_00103f2d;
              }
            }
            if (info.deleted_count != 1) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              if (info.deleted_count != 1) {
                pcVar6 = "info.deleted_count == 1";
                uVar11 = 0x7b;
                goto LAB_00103f2d;
              }
            }
            if (info.space_used == 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              if (info.space_used == 0) {
                pcVar6 = "info.space_used > 0";
                uVar11 = 0x7c;
                goto LAB_00103f2d;
              }
            }
            if (info.num_kv_stores != 1) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              if (info.num_kv_stores != 1) {
                pcVar6 = "info.num_kv_stores == 1";
                uVar11 = 0x7d;
                goto LAB_00103f2d;
              }
            }
            fdb_doc_create(&rdoc,(void *)local_4d0[4],*local_4d0,(void *)0x0,0,(void *)0x0,0);
            fVar4 = fdb_get_metaonly(db,rdoc);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x81);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x81,"void basic_test()");
            }
            if (rdoc->deleted == false) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              if (rdoc->deleted == false) {
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x82,"void basic_test()");
              }
            }
            pfVar10 = rdoc;
            pvVar1 = rdoc->meta;
            pvVar2 = (void *)local_4d0[7];
            iVar5 = bcmp(pvVar1,pvVar2,rdoc->metalen);
            if (iVar5 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x83);
              basic_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x83,"void basic_test()");
            }
            fdb_doc_free(pfVar10);
            rdoc = (fdb_doc *)0x0;
            fdb_kvs_close(db);
            fdb_close(dbfile);
            fdb_open(&dbfile,"./dummy1",&fconfig);
            fdb_kvs_open_default(dbfile,&db,&kvs_config);
            fVar4 = fdb_set_log_callback(db,logCallbackFunc,"basic_test");
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x8f);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x8f,"void basic_test()");
            }
            uVar9 = 0;
            for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 8) {
              sprintf(metabuf,"meta2%d",uVar9);
              sprintf(bodybuf,"body2%d",uVar9);
              sVar7 = strlen(metabuf);
              sVar8 = strlen(bodybuf);
              fdb_doc_update((fdb_doc **)((long)local_4f8 + lVar12),metabuf,sVar7,bodybuf,sVar8);
              fdb_set(db,*(fdb_doc **)((long)local_4f8 + lVar12));
              uVar9 = (ulong)((int)uVar9 + 1);
            }
            fdb_commit(dbfile,'\0');
            for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
              fdb_doc_create(&rdoc,local_4f8[lVar12]->key,local_4f8[lVar12]->keylen,(void *)0x0,0,
                             (void *)0x0,0);
              fVar4 = fdb_get(db,rdoc);
              pfVar10 = rdoc;
              if (lVar12 == 5) {
                if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xaa);
                  basic_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xaa,"void basic_test()");
                }
                pcVar6 = fdb_error_msg(FDB_RESULT_KEY_NOT_FOUND);
                iVar5 = strcmp(pcVar6,"key not found");
                if (iVar5 != 0) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                         );
                  basic_test()::__test_pass = '\x01';
                  pcVar6 = fdb_error_msg(FDB_RESULT_KEY_NOT_FOUND);
                  iVar5 = strcmp(pcVar6,"key not found");
                  if (iVar5 != 0) {
                    __assert_fail("!strcmp(fdb_error_msg(status), \"key not found\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0xab,"void basic_test()");
                  }
                }
              }
              else {
                if (fVar4 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa5);
                  basic_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xa5,"void basic_test()");
                }
                pvVar1 = rdoc->meta;
                pfVar3 = local_4f8[lVar12];
                pvVar2 = pfVar3->meta;
                iVar5 = bcmp(pvVar1,pvVar2,rdoc->metalen);
                if (iVar5 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa6);
                  basic_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xa6,"void basic_test()");
                }
                pvVar1 = pfVar10->body;
                pvVar2 = pfVar3->body;
                iVar5 = bcmp(pvVar1,pvVar2,pfVar10->bodylen);
                if (iVar5 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa7);
                  basic_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xa7,"void basic_test()");
                }
              }
              fdb_doc_free(rdoc);
              rdoc = (fdb_doc *)0x0;
            }
            fdb_compact(dbfile,"./dummy2");
            for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
              fdb_doc_create(&rdoc,local_4f8[lVar12]->key,local_4f8[lVar12]->keylen,(void *)0x0,0,
                             (void *)0x0,0);
              fVar4 = fdb_get(db,rdoc);
              pfVar10 = rdoc;
              if (lVar12 == 5) {
                if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc3);
                  basic_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xc3,"void basic_test()");
                }
              }
              else {
                if (fVar4 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xbe);
                  basic_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xbe,"void basic_test()");
                }
                pvVar1 = rdoc->meta;
                pfVar3 = local_4f8[lVar12];
                pvVar2 = pfVar3->meta;
                iVar5 = bcmp(pvVar1,pvVar2,rdoc->metalen);
                if (iVar5 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xbf);
                  basic_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xbf,"void basic_test()");
                }
                pvVar1 = pfVar10->body;
                pvVar2 = pfVar3->body;
                iVar5 = bcmp(pvVar1,pvVar2,pfVar10->bodylen);
                if (iVar5 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0);
                  basic_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xc0,"void basic_test()");
                }
              }
              fdb_doc_free(pfVar10);
              rdoc = (fdb_doc *)0x0;
            }
            uVar9 = 0;
            while (uVar9 != 0xd) {
              fdb_doc_create(&rdoc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
              rdoc->seqnum = uVar9 + 1;
              fVar4 = fdb_get_byseq(db,rdoc);
              if ((uVar9 < 0xb) &&
                 ((9 < (uint)uVar9 || ((0x3dcU >> ((uint)uVar9 & 0x1f) & 1) == 0)))) {
                if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd6);
                  basic_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xd6,"void basic_test()");
                }
              }
              else if (fVar4 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd3);
                basic_test()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xd3,"void basic_test()");
              }
              fdb_doc_free(rdoc);
              rdoc = (fdb_doc *)0x0;
              uVar9 = uVar9 + 1;
            }
            fdb_doc_create(&rdoc,(void *)local_4d0[4],*local_4d0,(void *)local_4d0[7],local_4d0[1],
                           (void *)0x0,0);
            fVar4 = fdb_set(db,rdoc);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xe2);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xe2,"void basic_test()");
            }
            fdb_doc_free(rdoc);
            rdoc = (fdb_doc *)0x0;
            fdb_commit(dbfile,'\0');
            fdb_doc_create(&rdoc,(void *)local_4d0[4],*local_4d0,(void *)0x0,0,(void *)0x0,0);
            fVar4 = fdb_get(db,rdoc);
            pfVar10 = rdoc;
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xea);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xea,"void basic_test()");
            }
            iVar5 = bcmp(rdoc->meta,(void *)local_4d0[7],rdoc->metalen);
            if (iVar5 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              pfVar10 = rdoc;
              basic_test()::__test_pass = '\x01';
              iVar5 = bcmp(rdoc->meta,(void *)local_4d0[7],rdoc->metalen);
              if (iVar5 != 0) {
                __assert_fail("memcmp(rdoc->meta, doc[5]->meta, rdoc->metalen) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xeb,"void basic_test()");
              }
            }
            if (pfVar10->body != (void *)0x0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              pfVar10 = rdoc;
              if (rdoc->body != (void *)0x0) {
                __assert_fail("rdoc->body == __null",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xec,"void basic_test()");
              }
            }
            if (pfVar10->bodylen != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              basic_test()::__test_pass = '\x01';
              pfVar10 = rdoc;
              if (rdoc->bodylen != 0) {
                __assert_fail("rdoc->bodylen == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xed,"void basic_test()");
              }
            }
            fdb_doc_free(pfVar10);
            rdoc = (fdb_doc *)0x0;
            fconfig.flags = 2;
            fVar4 = fdb_open(&dbfile_rdonly,"./dummy2",&fconfig);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf4);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xf4,"void basic_test()");
            }
            fVar4 = fdb_kvs_open_default(dbfile_rdonly,&db_rdonly,&kvs_config);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf6);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xf6,"void basic_test()");
            }
            fdb_doc_create(&rdoc,local_4f8[0]->key,local_4f8[0]->keylen,(void *)0x0,0,(void *)0x0,0)
            ;
            fVar4 = fdb_get(db_rdonly,rdoc);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xfa);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xfa,"void basic_test()");
            }
            fVar4 = fdb_set_log_callback(db_rdonly,logCallbackFunc,"basic_test");
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xfe);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xfe,"void basic_test()");
            }
            fVar4 = fdb_set(db_rdonly,(fdb_doc *)kvs_config.custom_cmp_param);
            if (fVar4 != FDB_RESULT_RONLY_VIOLATION) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x101);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_RONLY_VIOLATION",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x101,"void basic_test()");
            }
            pcVar6 = fdb_error_msg(FDB_RESULT_RONLY_VIOLATION);
            iVar5 = strcmp(pcVar6,"database is read-only");
            if (iVar5 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x102);
              basic_test()::__test_pass = '\x01';
              pcVar6 = fdb_error_msg(FDB_RESULT_RONLY_VIOLATION);
              iVar5 = strcmp(pcVar6,"database is read-only");
              if (iVar5 != 0) {
                __assert_fail("!strcmp(fdb_error_msg(status), \"database is read-only\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x102,"void basic_test()");
              }
            }
            fVar4 = fdb_commit(dbfile_rdonly,'\0');
            if (fVar4 != FDB_RESULT_RONLY_VIOLATION) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x105);
              basic_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_RONLY_VIOLATION",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x105,"void basic_test()");
            }
            fdb_doc_free(rdoc);
            rdoc = (fdb_doc *)0x0;
            fdb_kvs_close(db_rdonly);
            fdb_close(dbfile_rdonly);
            for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
              fdb_doc_free(local_4f8[lVar12]);
            }
            fdb_compact(dbfile,"./dummy3");
            fdb_kvs_close(db);
            fdb_close(dbfile);
            fdb_shutdown();
            memleak_end();
            pcVar6 = "%s PASSED\n";
            if (basic_test()::__test_pass != '\0') {
              pcVar6 = "%s FAILED\n";
            }
            fprintf(_stderr,pcVar6,"basic test");
            return;
          }
          uVar11 = 0x70;
        }
        else {
          uVar11 = 0x60;
        }
      }
      else {
        uVar11 = 0x54;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,(ulong)uVar11);
      pcVar6 = "status == FDB_RESULT_SUCCESS";
      goto LAB_00104de3;
    }
    uVar11 = 0x49;
  }
  else {
    uVar11 = 0x43;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,(ulong)uVar11);
  pcVar6 = "status == FDB_RESULT_NO_SUCH_FILE";
LAB_00104de3:
  basic_test()::__test_pass = 1;
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,uVar11,"void basic_test()");
}

Assistant:

void basic_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_rdonly;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_rdonly;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // Get the ForestDB version
    const char *version = fdb_get_lib_version();
    TEST_CHK(version != NULL && strlen(version) > 0);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // Read-Write mode test without a create flag.
    fconfig.flags = 0;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);
    TEST_CHK(!strcmp(fdb_error_msg(status), "no such file"));

    // Read-Only mode test: Must not create new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Read-Only and Create mode: Must not create a new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY | FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);
    TEST_CHK(!strcmp(fdb_error_msg(status), "invalid configuration"));

    // open and close db with a create flag.
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(!strcmp(fdb_error_msg(status), "success"));
    const char *file_version = fdb_get_file_version(dbfile);
    TEST_CHK(file_version != NULL && strlen(file_version) > 0);
    fdb_close(dbfile);

    // reopen db
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./dummy1",&fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // check the file info
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 9);
    TEST_CHK(info.deleted_count == 1);
    TEST_CHK(info.space_used > 0);
    TEST_CHK(info.num_kv_stores == 1);

    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get_metaonly(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(rdoc->deleted == true);
    TEST_CMP(rdoc->meta, doc[5]->meta, rdoc->metalen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            TEST_CHK(!strcmp(fdb_error_msg(status), "key not found"));
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // retrieve documents by sequence number
    for (i=0; i < n+3; ++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);
        if ( (i>=2 && i<=4) || (i>=6 && i<=9) || (i>=11 && i<=12)) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // update document #5 with an empty doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_set(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Check document #5 with respect to metadata and doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(memcmp(rdoc->meta, doc[5]->meta, rdoc->metalen) == 0);
    TEST_CHK(rdoc->body == NULL);
    TEST_CHK(rdoc->bodylen == 0);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // Read-Only mode test: Open succeeds if file exists, but disallow writes
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile_rdonly, "./dummy2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_rdonly, &db_rdonly, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db_rdonly, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db_rdonly, logCallbackFunc,
                                  (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db_rdonly, doc[i]);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);
    TEST_CHK(!strcmp(fdb_error_msg(status), "database is read-only"));

    status = fdb_commit(dbfile_rdonly, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);

    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_kvs_close(db_rdonly);
    fdb_close(dbfile_rdonly);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("basic test");
}